

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdApi.c
# Opt level: O0

int Cmd_CommandExecute(Abc_Frame_t *pAbc,char *sCommand)

{
  bool bVar1;
  char **local_38;
  char **argv;
  char *sCommandNext;
  int local_20;
  int loop;
  int argc;
  int fStatus;
  char *sCommand_local;
  Abc_Frame_t *pAbc_local;
  
  loop = 0;
  _argc = (char **)sCommand;
  sCommand_local = (char *)pAbc;
  if ((pAbc->fAutoexac == 0) && (pAbc->fSource == 0)) {
    Cmd_HistoryAddCommand(pAbc,sCommand);
  }
  argv = _argc;
  do {
    argv = (char **)CmdSplitLine((Abc_Frame_t *)sCommand_local,(char *)argv,&local_20,&local_38);
    sCommandNext._4_4_ = 0;
    loop = CmdApplyAlias((Abc_Frame_t *)sCommand_local,&local_20,&local_38,
                         (int *)((long)&sCommandNext + 4));
    if (loop == 0) {
      loop = CmdCommandDispatch((Abc_Frame_t *)sCommand_local,&local_20,&local_38);
    }
    CmdFreeArgv(local_20,local_38);
    bVar1 = false;
    if (loop == 0) {
      bVar1 = *(char *)argv != '\0';
    }
  } while (bVar1);
  return loop;
}

Assistant:

int Cmd_CommandExecute( Abc_Frame_t * pAbc, const char * sCommand )
{
    int fStatus = 0, argc, loop;
    const char * sCommandNext;
    char **argv;

    if ( !pAbc->fAutoexac && !pAbc->fSource ) 
	    Cmd_HistoryAddCommand(pAbc, sCommand);
    sCommandNext = sCommand;
    do 
    {
       	sCommandNext = CmdSplitLine( pAbc, sCommandNext, &argc, &argv );
		loop = 0;
		fStatus = CmdApplyAlias( pAbc, &argc, &argv, &loop );
		if ( fStatus == 0 ) 
			fStatus = CmdCommandDispatch( pAbc, &argc, &argv );
       	CmdFreeArgv( argc, argv );
    } 
    while ( fStatus == 0 && *sCommandNext != '\0' );
    return fStatus;
}